

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

void __thiscall ON_Hatch::ON_Hatch(ON_Hatch *this,ON_Hatch *src)

{
  double dVar1;
  
  ON_Object::ON_Object((ON_Object *)this,(ON_Object *)src);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00810150;
  ON_Plane::ON_Plane(&this->m_plane);
  this->m_pattern_scale = 1.0;
  this->m_pattern_rotation = 0.0;
  dVar1 = ON_2dPoint::Origin.y;
  (this->m_basepoint).x = ON_2dPoint::Origin.x;
  (this->m_basepoint).y = dVar1;
  (this->m_loops)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00810470;
  (this->m_loops).m_a = (ON_HatchLoop **)0x0;
  (this->m_loops).m_count = 0;
  (this->m_loops).m_capacity = 0;
  this->m_pattern_index = -1;
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_Hatch::ON_Hatch( const ON_Hatch& src)
  : ON_Geometry(src)
{
  Internal_CopyFrom(src);
}